

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

void * HokuyoThread(void *pParam)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  CRITICAL_SECTION *__mutex;
  long lVar10;
  char databuf [8192];
  double distances [2048];
  double angles [2048];
  int local_a054;
  HOKUYO *local_a050;
  ulong local_a048;
  void *local_a040;
  char local_a038 [8192];
  double local_8038 [2048];
  double local_4038 [2049];
  
  __mutex = HokuyoCS;
  lVar6 = 0;
  lVar10 = 0;
  do {
    if (*(void **)((long)addrsHokuyo + lVar6 * 2) == pParam) {
      local_a040 = (void *)((long)distancesHokuyo[0] + lVar10);
      local_a048 = 0;
      local_a050 = (HOKUYO *)pParam;
      do {
        memset(local_8038,0,0x4000);
        memset(local_4038,0,0x4000);
        memset(local_a038,0,0x2000);
        local_a054 = 0;
        iVar4 = GetLatestHokuyoMessageHokuyo(local_a050,local_a038,0x2000,&local_a054);
        uVar9 = 1;
        if (iVar4 == 0) {
          if (0 < local_a054) {
            iVar4 = local_a050->StartingStep;
            iVar2 = local_a050->SlitDivision;
            iVar3 = local_a050->FrontStep;
            dVar1 = local_a050->StepAngleSize;
            pcVar5 = local_a038;
            uVar7 = 0;
            do {
              local_4038[uVar7] =
                   ((double)((iVar4 - iVar3) + iVar2 / 2 + (int)uVar7) * dVar1 * 3.141592653589793)
                   / 180.0 + -3.141592653589793;
              lVar8 = 0;
              uVar9 = 0;
              do {
                uVar9 = (int)pcVar5[lVar8] - 0x30U | uVar9 << 6;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              local_8038[uVar7] = (double)(int)uVar9 / 1000.0;
              uVar7 = uVar7 + 1;
              pcVar5 = pcVar5 + 3;
            } while (uVar7 != (local_a054 - 1U) / 3 + 1);
          }
          uVar9 = (uint)local_a048;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy(local_a040,local_8038,0x4000);
        memcpy((void *)((long)anglesHokuyo[0] + lVar10),local_4038,0x4000);
        *(uint *)((long)resHokuyo + lVar6) = uVar9;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        local_a048 = (ulong)uVar9;
      } while (*(int *)((long)bExitHokuyo + lVar6) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar10 = lVar10 + 0x4000;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE HokuyoThread(void* pParam)
{
	HOKUYO* pHokuyo = (HOKUYO*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[MAX_SLITDIVISION_HOKUYO];
	double distances[MAX_SLITDIVISION_HOKUYO];

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	for (;;)
	{
		//mSleep(pHokuyo->threadperiod);
		memset(distances, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		memset(angles, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		res = GetLatestDataHokuyo(pHokuyo, distances, angles);
		if (res != EXIT_SUCCESS) err = res;
		// if (GetLatestDataHokuyo(pHokuyo, distances, angles) == EXIT8SUCCESS)
		{
			EnterCriticalSection(&HokuyoCS[id]);
			memcpy(distancesHokuyo[id], distances, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			memcpy(anglesHokuyo[id], angles, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			resHokuyo[id] = err;
			LeaveCriticalSection(&HokuyoCS[id]);
		}
		if (bExitHokuyo[id]) break;
	}

	return 0;
}